

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_shared_mutex.hpp
# Opt level: O3

bool __thiscall
yamc::fair::basic_shared_mutex<yamc::rwlock::PhaseFairness>::try_lock
          (basic_shared_mutex<yamc::rwlock::PhaseFairness> *this)

{
  basic_shared_mutex<yamc::rwlock::PhaseFairness> *pbVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)(this + 0x60));
  if (iVar2 == 0) {
    pbVar1 = *(basic_shared_mutex<yamc::rwlock::PhaseFairness> **)(this + 8);
    if (pbVar1 == this) {
      detail::shared_mutex_base<yamc::rwlock::PhaseFairness>::wq_push_locknode
                ((shared_mutex_base<yamc::rwlock::PhaseFairness> *)this,0);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(this + 0x60));
    return pbVar1 == this;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool try_lock()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    return base::impl_try_lock();
  }